

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O3

bool __thiscall
SqModules::compileScript
          (SqModules *this,vector<char,_std::allocator<char>_> *buf,char *resolved_fn,
          char *requested_fn,HSQOBJECT *bindings,Object *script_closure,string *out_err_msg,
          SqASTData **return_ast)

{
  HSQOBJECT *po;
  bool bVar1;
  char *sourcename;
  long *plVar2;
  SQCollectable *pSVar3;
  long *plVar4;
  HSQUIRRELVM pSVar5;
  char buffer [4096];
  undefined1 local_10c0 [24];
  long lStack_10a8;
  char *local_10a0;
  SQCollectable *local_1098;
  long local_1090;
  SQCollectable local_1088;
  SQObjectValue *local_1058 [2];
  SQObjectValue local_1048 [2];
  char local_1038 [4104];
  
  po = &script_closure->obj;
  local_10a0 = requested_fn;
  sq_release(script_closure->vm,po);
  sq_resetobject(po);
  memset(local_1038,0,0x1000);
  sourcename = resolved_fn;
  if ((this->compilationOptions).useAbsolutePath == true) {
    sourcename = realpath(resolved_fn,local_1038);
    if (sourcename == (char *)0x0) {
      sourcename = resolved_fn;
    }
  }
  bVar1 = compileScriptImpl(this,buf,sourcename,bindings,return_ast);
  if (bVar1) {
    Sqrat::Var<Sqrat::Object>::Var((Var<Sqrat::Object> *)local_10c0,this->sqvm,-1);
    sq_release(script_closure->vm,po);
    script_closure->vm = (HSQUIRRELVM)local_10c0._0_8_;
    po->_type = local_10c0._8_4_;
    po->_flags = local_10c0[0xc];
    *(undefined3 *)&po->field_0x5 = local_10c0._13_3_;
    (script_closure->obj)._unVal = (SQObjectValue)local_10c0._16_8_;
    sq_resetobject((HSQOBJECT *)(local_10c0 + 8));
    Sqrat::Object::~Object((Object *)local_10c0);
    sq_pop(this->sqvm,1);
  }
  else {
    local_1058[0] = local_1048;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1058,"Failed to compile file: ","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_1058);
    pSVar3 = (SQCollectable *)(plVar2 + 2);
    if ((SQCollectable *)*plVar2 == pSVar3) {
      local_1088.super_SQRefCounted._vptr_SQRefCounted =
           (pSVar3->super_SQRefCounted)._vptr_SQRefCounted;
      local_1088.super_SQRefCounted._uiRef = plVar2[3];
      local_1098 = &local_1088;
    }
    else {
      local_1088.super_SQRefCounted._vptr_SQRefCounted =
           (pSVar3->super_SQRefCounted)._vptr_SQRefCounted;
      local_1098 = (SQCollectable *)*plVar2;
    }
    local_1090 = plVar2[1];
    *plVar2 = (long)pSVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1098);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_1088._gc_prev = (SQCollectable *)*plVar4;
      local_1088._sharedstate = (SQSharedState *)plVar2[3];
      local_1088.super_SQRefCounted._weakref = (SQWeakRef *)((long)&local_1088 + 0x20);
    }
    else {
      local_1088._gc_prev = (SQCollectable *)*plVar4;
      local_1088.super_SQRefCounted._weakref = (SQWeakRef *)*plVar2;
    }
    local_1088._gc_next = (SQCollectable *)plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((undefined1 *)((long)&local_1088 + 0x10));
    pSVar5 = (HSQUIRRELVM)(plVar2 + 2);
    if ((HSQUIRRELVM)*plVar2 == pSVar5) {
      local_10c0._16_8_ = (pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted;
      lStack_10a8 = plVar2[3];
      local_10c0._0_8_ = (HSQUIRRELVM)(local_10c0 + 0x10);
    }
    else {
      local_10c0._16_8_ = (pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted;
      local_10c0._0_8_ = (HSQUIRRELVM)*plVar2;
    }
    local_10c0._8_8_ = plVar2[1];
    *plVar2 = (long)pSVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)out_err_msg,(string *)local_10c0);
    if ((HSQUIRRELVM)local_10c0._0_8_ != (HSQUIRRELVM)(local_10c0 + 0x10)) {
      operator_delete((void *)local_10c0._0_8_,local_10c0._16_8_ + 1);
    }
    if (local_1088.super_SQRefCounted._weakref != (SQWeakRef *)((long)&local_1088 + 0x20)) {
      operator_delete(local_1088.super_SQRefCounted._weakref,(long)local_1088._gc_prev + 1);
    }
    if (local_1098 != &local_1088) {
      operator_delete(local_1098,(long)local_1088.super_SQRefCounted._vptr_SQRefCounted + 1);
    }
    if (local_1058[0] != local_1048) {
      operator_delete(local_1058[0],local_1048[0].nInteger + 1);
    }
  }
  return bVar1;
}

Assistant:

bool SqModules::compileScript(const std::vector<char> &buf, const char *resolved_fn, const char *requested_fn,
                                                        const HSQOBJECT *bindings,
                                                        Sqrat::Object &script_closure, string &out_err_msg,
                                                        SQCompilation::SqASTData **return_ast)
{
  script_closure.Release();

  const char *filePath = resolved_fn;
  char buffer[MAX_PATH_LENGTH] = {0};

  if (compilationOptions.useAbsolutePath) {
    const char *r = computeAbsolutePath(resolved_fn, buffer, MAX_PATH_LENGTH);
    if (r)
      filePath = r;
  }

  if (!compileScriptImpl(buf, filePath, bindings, return_ast))
  {
    out_err_msg = string("Failed to compile file: ") + requested_fn + " / " + resolved_fn;
    return false;
  }

  script_closure = Sqrat::Var<Sqrat::Object>(sqvm, -1).value;
  sq_pop(sqvm, 1);

  return true;
}